

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::setScenePosItemEnabled
          (QGraphicsScenePrivate *this,QGraphicsItem *item,bool enabled)

{
  QGraphicsItem *pQVar1;
  QGraphicsItemPrivate *pQVar2;
  undefined7 in_register_00000011;
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *pQVar3;
  
  pQVar3 = &item->d_ptr;
  while (pQVar1 = pQVar3->d->parent, pQVar1 != (QGraphicsItem *)0x0) {
    pQVar2 = (pQVar1->d_ptr).d;
    pQVar3 = &pQVar1->d_ptr;
    *(uint *)&pQVar2->field_0x168 =
         *(uint *)&pQVar2->field_0x168 & 0xffffff7f |
         (int)CONCAT71(in_register_00000011,enabled) << 7;
  }
  if ((!enabled) && ((*(uint *)&this->field_0xb8 >> 8 & 1) == 0)) {
    *(uint *)&this->field_0xb8 = *(uint *)&this->field_0xb8 | 0x100;
    QMetaObject::invokeMethod<>
              (*(QObject **)&this->field_0x8,"_q_updateScenePosDescendants",QueuedConnection);
    return;
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::setScenePosItemEnabled(QGraphicsItem *item, bool enabled)
{
    QGraphicsItem *p = item->d_ptr->parent;
    while (p) {
        p->d_ptr->scenePosDescendants = enabled;
        p = p->d_ptr->parent;
    }
    if (!enabled && !scenePosDescendantsUpdatePending) {
        scenePosDescendantsUpdatePending = true;
        QMetaObject::invokeMethod(q_func(), "_q_updateScenePosDescendants", Qt::QueuedConnection);
    }
}